

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicBuildSeparable::Run(BasicBuildSeparable *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  GLuint program;
  undefined4 extraout_EAX;
  int iVar4;
  undefined4 extraout_EAX_00;
  Vector<float,_4> *pVVar5;
  bool *compile_error;
  uint uVar6;
  GLuint buffer;
  GLuint pipeline;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  char *cs [4];
  
  cs[2] = 
  "\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput();\nvoid Run() {\n  g_output = CalculateOutput();\n}"
  ;
  cs[3] = "\nvec4 CalculateOutput() {\n  g_output = vec4(0);\n  return vec4(1, 2, 3, 4);\n}";
  cs[0] = "#version 310 es";
  cs[1] = "\nlayout(local_size_x = 1) in;\nvoid Run();\nvoid main() {\n  Run();\n}";
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x91b9,4,cs);
  bVar3 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,program,compile_error);
  uVar6 = (uint)bVar3;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,buffer);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pipeline,0.0);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(Vector<float,_4> *)&pipeline,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  pVVar5 = (Vector<float,_4> *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
  tcu::Vector<float,_4>::Vector(&local_68,pVVar5);
  auVar1._4_4_ = -(uint)(local_68.m_data[1] != 2.0);
  auVar1._0_4_ = -(uint)(local_68.m_data[0] != 1.0);
  auVar1._8_4_ = -(uint)(local_68.m_data[2] != 3.0);
  auVar1._12_4_ = -(uint)(local_68.m_data[3] != 4.0);
  iVar4 = movmskps(extraout_EAX,auVar1);
  if (iVar4 != 0) {
    uVar6 = 0;
    anon_unknown_0::Output("Invalid value!\n");
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pipeline,0.0);
  glu::CallLogWrapper::glBufferSubData(this_00,0x90d2,0,0x10,(Vector<float,_4> *)&pipeline);
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&pipeline);
  glu::CallLogWrapper::glUseProgramStages(this_00,pipeline,0x20,program);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  pVVar5 = (Vector<float,_4> *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
  tcu::Vector<float,_4>::Vector(&local_78,pVVar5);
  auVar2._4_4_ = -(uint)(local_78.m_data[1] != 2.0);
  auVar2._0_4_ = -(uint)(local_78.m_data[0] != 1.0);
  auVar2._8_4_ = -(uint)(local_78.m_data[2] != 3.0);
  auVar2._12_4_ = -(uint)(local_78.m_data[3] != 4.0);
  iVar4 = movmskps(extraout_EAX_00,auVar2);
  if (iVar4 != 0) {
    uVar6 = 0;
    anon_unknown_0::Output("Invalid value!\n");
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&pipeline);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return (ulong)uVar6 - 1;
}

Assistant:

virtual long Run()
	{
		const char* const cs[4] = {
			"#version 310 es",

			NL "layout(local_size_x = 1) in;" NL "void Run();" NL "void main() {" NL "  Run();" NL "}",

			NL "layout(binding = 0, std430) buffer Output {" NL "  vec4 g_output;" NL "};" NL
			   "vec4 CalculateOutput();" NL "void Run() {" NL "  g_output = CalculateOutput();" NL "}",

			NL "vec4 CalculateOutput() {" NL "  g_output = vec4(0);" NL "  return vec4(1, 2, 3, 4);" NL "}"
		};

		const GLuint p   = glCreateShaderProgramv(GL_COMPUTE_SHADER, 4, cs);
		bool		 res = CheckProgram(p);

		GLuint buffer;
		glGenBuffers(1, &buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), &vec4(0.0f)[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(p);
		glDispatchCompute(1, 1, 1);

		vec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), GL_MAP_READ_BIT));
		if (!IsEqual(data[0], vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &vec4(0.0f)[0]);

		GLuint pipeline;
		glGenProgramPipelines(1, &pipeline);
		glUseProgramStages(pipeline, GL_COMPUTE_SHADER_BIT, p);

		glUseProgram(0);
		glBindProgramPipeline(pipeline);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), GL_MAP_READ_BIT));

		if (!IsEqual(data[0], vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		glDeleteProgramPipelines(1, &pipeline);
		glDeleteBuffers(1, &buffer);
		glDeleteProgram(p);

		return res == true ? NO_ERROR : ERROR;
	}